

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::OnDataDictionary
          (PixieProvider *this,DataDictionaryMessage *dict_message)

{
  logger *this_00;
  _Alloc_hider __p;
  bool bVar1;
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  field_defs;
  string local_40;
  
  bVar1 = DataDictionaryMessage::IsUpdate(dict_message);
  this_00 = Log;
  if (bVar1) {
    DataDictionaryMessage::ToString_abi_cxx11_(&local_40,dict_message);
    spdlog::logger::info<std::__cxx11::string>
              (this_00,"updated current dictionary with new fields: {}",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    DataDictionaryMessage::GetFieldDefs
              ((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40,dict_message);
    DataDictionaryUtils::AddAllFields
              ((this->data_dictionary_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>.
               _M_head_impl,
               (vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40);
  }
  else {
    DataDictionaryMessage::ToString_abi_cxx11_(&local_40,dict_message);
    spdlog::logger::info<std::__cxx11::string>(this_00,"replacing dictionary with: {}",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::make_unique<bidfx_public_api::price::pixie::ExtendableDataDictionary>();
    __p._M_p = local_40._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
    ::reset((__uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
             *)&this->data_dictionary_,(pointer)__p._M_p);
    std::
    unique_ptr<bidfx_public_api::price::pixie::ExtendableDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::ExtendableDataDictionary>_>
    ::~unique_ptr((unique_ptr<bidfx_public_api::price::pixie::ExtendableDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::ExtendableDataDictionary>_>
                   *)&local_40);
    DataDictionaryMessage::GetFieldDefs
              ((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40,dict_message);
    DataDictionaryUtils::AddAllFields
              ((this->data_dictionary_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>.
               _M_head_impl,
               (vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40);
  }
  std::
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  ::~vector((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
             *)&local_40);
  return;
}

Assistant:

void PixieProvider::OnDataDictionary(DataDictionaryMessage& dict_message)
{
    if (dict_message.IsUpdate())
    {
        Log->info("updated current dictionary with new fields: {}", dict_message.ToString());
        auto field_defs = dict_message.GetFieldDefs();
        DataDictionaryUtils::AddAllFields(*data_dictionary_, field_defs);
    }
    else
    {
        Log->info("replacing dictionary with: {}", dict_message.ToString());
        data_dictionary_ = std::make_unique<ExtendableDataDictionary>();
        auto field_defs = dict_message.GetFieldDefs();
        DataDictionaryUtils::AddAllFields(*data_dictionary_, field_defs);
    }
}